

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogDerivativesStates
          (BeagleCPUImpl<double,_1,_0> *this,int *tipStates,double *preOrderPartial,
          int firstDerivativeIndex,int secondDerivativeIndex,double *categoryRates,
          double *categoryWeights,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  double dVar1;
  double *pdVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int k;
  double denominator;
  double numerator;
  int state;
  int patternIndex;
  int pattern;
  int category;
  double *firstDerivMatrix;
  double *categoryRates_local;
  int secondDerivativeIndex_local;
  int firstDerivativeIndex_local;
  double *preOrderPartial_local;
  int *tipStates_local;
  BeagleCPUImpl<double,_1,_0> *this_local;
  
  pdVar2 = this->gTransitionMatrices[firstDerivativeIndex];
  for (category = 0; category < this->kCategoryCount; category = category + 1) {
    for (pattern = 0; pattern < this->kPatternCount; pattern = pattern + 1) {
      iVar3 = category * this->kPatternCount + pattern;
      numerator = 0.0;
      dVar1 = preOrderPartial
              [iVar3 * this->kPartialsPaddedStateCount + tipStates[pattern] % this->kStateCount];
      for (k = 0; k < this->kStateCount; k = k + 1) {
        auVar7._8_8_ = 0;
        auVar7._0_8_ = pdVar2[category * this->kMatrixSize + k * this->kTransPaddedStateCount +
                              tipStates[pattern]];
        auVar4._8_8_ = 0;
        auVar4._0_8_ = preOrderPartial[iVar3 * this->kPartialsPaddedStateCount + k];
        auVar10._8_8_ = 0;
        auVar10._0_8_ = numerator;
        auVar5 = vfmadd213sd_fma(auVar4,auVar7,auVar10);
        numerator = auVar5._0_8_;
      }
      auVar8._8_8_ = 0;
      auVar8._0_8_ = categoryWeights[category];
      auVar5._8_8_ = 0;
      auVar5._0_8_ = numerator;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = this->grandNumeratorDerivTmp[pattern];
      auVar5 = vfmadd213sd_fma(auVar5,auVar8,auVar11);
      this->grandNumeratorDerivTmp[pattern] = auVar5._0_8_;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = categoryWeights[category];
      auVar6._8_8_ = 0;
      auVar6._0_8_ = dVar1;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = this->grandDenominatorDerivTmp[pattern];
      auVar5 = vfmadd213sd_fma(auVar6,auVar9,auVar12);
      this->grandDenominatorDerivTmp[pattern] = auVar5._0_8_;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogDerivativesStates(const int *tipStates,
                                                                     const REALTYPE *preOrderPartial,
                                                                     const int firstDerivativeIndex,
                                                                     const int secondDerivativeIndex,
                                                                     const double *categoryRates,
                                                                     const REALTYPE *categoryWeights,
                                                                     double *outDerivatives,
                                                                     double *outSumDerivatives,
                                                                     double *outSumSquaredDerivatives) {

    const REALTYPE *firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];

    for (int category = 0; category < kCategoryCount; category++) {

        for (int pattern = 0; pattern < kPatternCount; pattern++) {

            const int patternIndex = category * kPatternCount + pattern;
            const int state = tipStates[pattern];

            REALTYPE numerator = 0.0;
            REALTYPE denominator = preOrderPartial[patternIndex * kPartialsPaddedStateCount + (state % kStateCount)];
            // TODO (state % kStateCount) is not correct; should imply missing character
            // TODO See calcCrossProductsStates() for possible solution

            for (int k = 0; k < kStateCount; k++) {
                numerator += firstDerivMatrix[category * kMatrixSize + k * kTransPaddedStateCount + state] *
                             preOrderPartial[patternIndex * kPartialsPaddedStateCount + k];
            }

            grandNumeratorDerivTmp[pattern] += categoryWeights[category] * numerator;
            grandDenominatorDerivTmp[pattern] += categoryWeights[category] * denominator;
        }
    }
}